

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall
DLevelScript::DoSpawnSpot(DLevelScript *this,int type,int spot,int tid,int angle,bool force)

{
  bool bVar1;
  int iVar2;
  AActor *this_00;
  TAngle<double> local_80;
  DVector3 local_78;
  TAngle<double> local_60;
  DVector3 local_58;
  AActor *local_40;
  AActor *aspot;
  FActorIterator iterator;
  int spawned;
  bool force_local;
  int angle_local;
  int tid_local;
  int spot_local;
  int type_local;
  DLevelScript *this_local;
  
  iterator.id = 0;
  iterator._15_1_ = force;
  if (spot == 0) {
    bVar1 = TObjPtr<AActor>::operator!=(&this->activator,(AActor *)0x0);
    if (bVar1) {
      this_00 = TObjPtr<AActor>::operator->(&this->activator);
      AActor::Pos(&local_78,this_00);
      TAngle<double>::TAngle(&local_80,(double)angle * 1.40625);
      iVar2 = DoSpawn(type,&local_78,tid,&local_80,(bool)(iterator._15_1_ & 1));
      iterator.id = iVar2 + iterator.id;
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)&aspot,spot);
    while (local_40 = FActorIterator::Next((FActorIterator *)&aspot), local_40 != (AActor *)0x0) {
      AActor::Pos(&local_58,local_40);
      TAngle<double>::TAngle(&local_60,(double)angle * 1.40625);
      iVar2 = DoSpawn(type,&local_58,tid,&local_60,(bool)(iterator._15_1_ & 1));
      iterator.id = iVar2 + iterator.id;
    }
  }
  return iterator.id;
}

Assistant:

int DLevelScript::DoSpawnSpot (int type, int spot, int tid, int angle, bool force)
{
	int spawned = 0;

	if (spot != 0)
	{
		FActorIterator iterator (spot);
		AActor *aspot;

		while ( (aspot = iterator.Next ()) )
		{
			spawned += DoSpawn (type, aspot->Pos(), tid, angle * (360. / 256), force);
		}
	}
	else if (activator != NULL)
	{
		spawned += DoSpawn (type, activator->Pos(), tid, angle * (360. / 256), force);
	}
	return spawned;
}